

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O1

void __thiscall
deqp::egl::Image::NativeSurface<eglu::NativeWindow>::~NativeSurface
          (NativeSurface<eglu::NativeWindow> *this)

{
  NativeWindow *pNVar1;
  
  (this->super_ManagedSurface)._vptr_ManagedSurface = (_func_int **)&PTR__NativeSurface_02167ab8;
  pNVar1 = (this->m_native).
           super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr;
  if (pNVar1 != (NativeWindow *)0x0) {
    (*pNVar1->_vptr_NativeWindow[1])();
    (this->m_native).super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.
    m_data.ptr = (NativeWindow *)0x0;
  }
  (this->super_ManagedSurface)._vptr_ManagedSurface = (_func_int **)&PTR__ManagedSurface_02167a88;
  de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::reset
            (&(this->super_ManagedSurface).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit		NativeSurface	(MovePtr<UniqueSurface>	surface,
									 MovePtr<T>				native)
						: ManagedSurface	(surface)
						, m_native			(native) {}